

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueType.cpp
# Opt level: O0

size_t ValueType::GetLowestBitIndex(Bits b)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  uint local_10;
  Bits local_a;
  DWORD i;
  Bits b_local;
  
  local_a = b;
  bVar2 = operator!(b);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x5a7,"(b)","b");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  GetFirstBitSet(&local_10,(uint)local_a);
  return (ulong)local_10;
}

Assistant:

size_t ValueType::GetLowestBitIndex(const Bits b)
{
    Assert(b);

    DWORD i;
    ::GetFirstBitSet(&i, static_cast<UnitWord32>(b));
    return i;
}